

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.hpp
# Opt level: O0

void __thiscall ui::UI::add_layer(UI *this,string *name,Renderable *r)

{
  undefined1 local_48 [40];
  pointer local_20;
  Renderable *r_local;
  string *name_local;
  UI *this_local;
  
  local_20 = r;
  r_local = (Renderable *)name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)local_48,(string *)name);
  std::unique_ptr<ui::Renderable,std::default_delete<ui::Renderable>>::
  unique_ptr<std::default_delete<ui::Renderable>,void>
            ((unique_ptr<ui::Renderable,std::default_delete<ui::Renderable>> *)(local_48 + 0x20),
             local_20);
  std::vector<ui::layer_t,_std::allocator<ui::layer_t>_>::push_back
            (&this->_layers,(value_type *)local_48);
  layer_t::~layer_t((layer_t *)local_48);
  (*(local_20->super_Area)._vptr_Area[8])(local_20,local_20);
  (*(local_20->super_Area)._vptr_Area[1])();
  (**(local_20->super_Area)._vptr_Area)();
  (*(local_20->super_Area)._vptr_Area[0xc])();
  return;
}

Assistant:

void add_layer(std::string name, Renderable *r) {
            _layers.push_back(layer_t {name, std::unique_ptr<Renderable>(r)});
            r->set_root(r);
            r->recalculate_dimension();
            r->recalculate_origin();
            r->show();
        }